

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  uint64 extraout_RDX;
  uint64 extraout_RDX_00;
  uint128 n;
  uint128 n_00;
  uint128 local_108;
  undefined1 local_f8 [8];
  uint128 shifted_divisor;
  uint128 quotient;
  int difference;
  int divisor_bit_length;
  undefined1 auStack_a0 [4];
  int dividend_bit_length;
  uint64 local_98;
  LogFinisher local_8d [13];
  LogMessage local_80;
  uint128 local_48;
  uint128 *local_38;
  uint128 *remainder_ret_local;
  uint128 *quotient_ret_local;
  uint128 divisor_local;
  uint128 dividend_local;
  
  divisor_local.lo_ = divisor.hi_;
  quotient_ret_local = (uint128 *)divisor.lo_;
  n.lo_ = dividend.hi_;
  divisor_local.hi_ = dividend.lo_;
  local_38 = remainder_ret;
  remainder_ret_local = quotient_ret;
  uint128(&local_48,0);
  bVar1 = protobuf::operator==((uint128 *)&quotient_ret_local,&local_48);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,"third_party/protobuf-lite/int128.cc",0x56);
    pLVar4 = internal::LogMessage::operator<<(&local_80,"Division or mod by zero: dividend.hi=");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,n.lo_);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,", lo=");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,divisor_local.hi_);
    internal::LogFinisher::operator=(local_8d,pLVar4);
    internal::LogMessage::~LogMessage(&local_80);
  }
  else {
    bVar1 = operator<((uint128 *)&divisor_local.hi_,(uint128 *)&quotient_ret_local);
    if (bVar1) {
      uint128((uint128 *)auStack_a0,0);
      remainder_ret_local->lo_ = _auStack_a0;
      remainder_ret_local->hi_ = local_98;
      local_38->lo_ = divisor_local.hi_;
      local_38->hi_ = n.lo_;
    }
    else {
      n.hi_ = extraout_RDX;
      iVar2 = Fls128((protobuf *)divisor_local.hi_,n);
      n_00.hi_ = extraout_RDX_00;
      n_00.lo_ = divisor_local.lo_;
      iVar3 = Fls128((protobuf *)quotient_ret_local,n_00);
      uint128((uint128 *)&shifted_divisor.hi_,0);
      for (quotient.hi_._4_4_ = iVar2 - iVar3; -1 < quotient.hi_._4_4_;
          quotient.hi_._4_4_ = quotient.hi_._4_4_ + -1) {
        operator<<=((uint128 *)&shifted_divisor.hi_,1);
        _local_f8 = protobuf::operator<<((uint128 *)&quotient_ret_local,quotient.hi_._4_4_);
        bVar1 = operator<=((uint128 *)local_f8,(uint128 *)&divisor_local.hi_);
        if (bVar1) {
          operator-=((uint128 *)&divisor_local.hi_,(uint128 *)local_f8);
          uint128(&local_108,1);
          operator+=((uint128 *)&shifted_divisor.hi_,&local_108);
        }
      }
      remainder_ret_local->lo_ = shifted_divisor.hi_;
      remainder_ret_local->hi_ = quotient.lo_;
      local_38->lo_ = divisor_local.hi_;
      local_38->hi_ = n.lo_;
    }
  }
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  } else if (dividend < divisor) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  } else {
    int dividend_bit_length = Fls128(dividend);
    int divisor_bit_length = Fls128(divisor);
    int difference = dividend_bit_length - divisor_bit_length;
    uint128 quotient = 0;
    while (difference >= 0) {
      quotient <<= 1;
      uint128 shifted_divisor = divisor << difference;
      if (shifted_divisor <= dividend) {
        dividend -= shifted_divisor;
        quotient += 1;
      }
      difference -= 1;
    }
    //record the final quotient and remainder
    *quotient_ret = quotient;
    *remainder_ret = dividend;
  }
}